

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2Test.cpp
# Opt level: O1

void __thiscall S2NoAllocation::test_method(S2NoAllocation *this)

{
  size_t size;
  double *__ptr;
  ulong uVar1;
  double *__ptr_00;
  ulong uVar2;
  double *__ptr_01;
  void *pvVar3;
  undefined8 *puVar4;
  char *__function;
  Index cols;
  Index outer_stride;
  VectorXd x;
  VectorXd vx;
  MatrixXd H0;
  VectorXd y;
  MatrixXd H2;
  MatrixXd H1;
  MatrixXd J0;
  S2 Space;
  void *local_3c8;
  long local_3c0;
  void *local_3b8;
  long lStack_3b0;
  void *local_3a0;
  undefined8 uStack_398;
  void *local_388;
  long local_380;
  void *local_378;
  long lStack_370;
  void *local_360;
  undefined8 uStack_358;
  void *local_350;
  ulong local_348;
  ulong local_340;
  void *local_338;
  long local_330;
  void *local_328;
  ulong local_320;
  ulong local_318;
  void *local_310;
  ulong local_308;
  ulong local_300;
  void *local_2f8;
  void *pvStack_2f0;
  undefined8 uStack_2e8;
  void *local_2e0;
  undefined8 uStack_2d8;
  void *local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  void *local_1c8;
  ulong uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  void *local_198;
  ulong uStack_190;
  ulong local_188;
  ulong uStack_180;
  void *local_168;
  ulong uStack_160;
  ulong local_158;
  ulong uStack_150;
  double *local_138;
  undefined8 uStack_130;
  ulong local_128;
  undefined8 uStack_120;
  double *local_108;
  size_t sStack_100;
  double *local_e8;
  size_t sStack_e0;
  void *local_d0 [3];
  S2 local_b8 [136];
  
  mnf::S2::S2(local_b8);
  mnf::Manifold::createRandomPoint(1.0);
  mnf::SubPoint::value();
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_3c8,
             (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              *)&local_3b8);
  mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)&local_2e0);
  free(pvStack_2f0);
  mnf::Manifold::createRandomPoint(1.0);
  mnf::SubPoint::value();
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_338,
             (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              *)&local_3b8);
  mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)&local_2e0);
  free(pvStack_2f0);
  local_2e0 = (void *)0x0;
  uStack_2d8 = 0;
  local_2f8 = local_3c8;
  pvStack_2f0 = (void *)local_3c0;
  if (local_3c0 < 0 && local_3c8 != (void *)0x0) goto LAB_00118024;
  mnf::S2::randVec((Ref_conflict *)&local_3b8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_388,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_3b8);
  free(local_2e0);
  size = mnf::Manifold::representationDim();
  if ((long)size < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (size == 0) {
    __ptr = (double *)0x0;
  }
  else {
    __ptr = Eigen::internal::conditional_aligned_new_auto<double,true>(size);
  }
  pvStack_2f0 = (void *)mnf::Manifold::representationDim();
  local_2f8 = (void *)0x3;
  if ((long)pvStack_2f0 < 0) goto LAB_0011803b;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_d0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_2f8);
  uVar1 = mnf::Manifold::representationDim();
  if ((long)uVar1 < 0) {
LAB_00118079:
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if (0x2aaaaaaaaaaaaaaa < uVar1) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = operator_delete;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if (uVar1 == 0) {
    __ptr_00 = (double *)0x0;
  }
  else {
    __ptr_00 = Eigen::internal::conditional_aligned_new_auto<double,true>(uVar1 * 3);
  }
  uVar2 = mnf::Manifold::representationDim();
  if ((long)uVar2 < 0) goto LAB_00118079;
  if (0x2aaaaaaaaaaaaaaa < uVar2) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = operator_delete;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if (uVar2 == 0) {
    __ptr_01 = (double *)0x0;
  }
  else {
    __ptr_01 = Eigen::internal::conditional_aligned_new_auto<double,true>(uVar2 * 3);
  }
  pvVar3 = (void *)mnf::Manifold::tangentDim();
  pvStack_2f0 = (void *)mnf::Manifold::tangentDim();
  local_2f8 = pvVar3;
  if ((long)((ulong)pvStack_2f0 | (ulong)pvVar3) < 0) {
LAB_0011803b:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_350,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_2f8);
  pvVar3 = (void *)mnf::Manifold::tangentDim();
  pvStack_2f0 = (void *)mnf::Manifold::tangentDim();
  local_2f8 = pvVar3;
  if ((long)((ulong)pvStack_2f0 | (ulong)pvVar3) < 0) goto LAB_0011803b;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_310,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_2f8);
  pvVar3 = (void *)mnf::Manifold::tangentDim();
  pvStack_2f0 = (void *)mnf::Manifold::tangentDim();
  local_2f8 = pvVar3;
  if ((long)((ulong)pvStack_2f0 | (ulong)pvVar3) < 0) goto LAB_0011803b;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_328,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_2f8);
  Eigen::internal::is_malloc_allowed_impl(bool,bool)::value = 0;
  mnf::utils::set_is_malloc_allowed(false);
  local_2e0 = (void *)0x0;
  uStack_2d8 = 0;
  local_2f8 = local_3c8;
  pvStack_2f0 = (void *)local_3c0;
  local_e8 = __ptr;
  sStack_e0 = size;
  if (-1 < local_3c0 || local_3c8 == (void *)0x0) {
    local_3a0 = (void *)0x0;
    uStack_398 = 0;
    local_3b8 = local_388;
    lStack_3b0 = local_380;
    if (-1 < local_380 || local_388 == (void *)0x0) {
      mnf::Manifold::retractation(local_b8,&local_e8,&local_2f8,&local_3b8);
      free(local_3a0);
      free(local_2e0);
      local_2e0 = (void *)0x0;
      uStack_2d8 = 0;
      local_2f8 = local_3c8;
      pvStack_2f0 = (void *)local_3c0;
      local_108 = __ptr;
      sStack_100 = size;
      if (-1 < local_3c0 || local_3c8 == (void *)0x0) {
        local_3a0 = (void *)0x0;
        uStack_398 = 0;
        local_3b8 = local_338;
        lStack_3b0 = local_330;
        if (-1 < local_330 || local_338 == (void *)0x0) {
          mnf::Manifold::pseudoLog(local_b8,&local_108,&local_2f8,&local_3b8);
          free(local_3a0);
          free(local_2e0);
          uStack_130 = 3;
          uStack_120 = 3;
          uStack_2e8 = 0;
          local_2e0 = (void *)0x0;
          local_2f8 = (void *)0x0;
          pvStack_2f0 = (void *)0x0;
          local_2d0 = (void *)0x0;
          uStack_2c8 = 0;
          local_2c0 = 0;
          local_138 = __ptr_00;
          local_128 = uVar1;
          Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
          construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                     &local_2f8,local_d0);
          local_3a0 = (void *)0x0;
          uStack_398 = 0;
          local_3b8 = local_3c8;
          lStack_3b0 = local_3c0;
          if (-1 < local_3c0 || local_3c8 == (void *)0x0) {
            mnf::Manifold::applyDiffRetractation(local_b8,&local_138,&local_2f8,&local_3b8);
            free(local_3a0);
            free(local_2d0);
            uStack_150 = 0;
            local_168 = local_310;
            uStack_160 = local_308;
            local_158 = local_300;
            if ((long)(local_300 | local_308) < 0 && local_310 != (void *)0x0) {
LAB_0011805a:
              __function = 
              "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1>>, Level = 0]"
              ;
              goto LAB_0011806f;
            }
            uStack_150 = local_308;
            uStack_2e8 = 0;
            local_2e0 = (void *)0x0;
            local_2f8 = (void *)0x0;
            pvStack_2f0 = (void *)0x0;
            local_2d0 = (void *)0x0;
            uStack_2c8 = 0;
            local_2c0 = 0;
            Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
            construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                       &local_2f8,&local_350);
            local_3a0 = (void *)0x0;
            uStack_398 = 0;
            local_3b8 = local_3c8;
            lStack_3b0 = local_3c0;
            if (-1 < local_3c0 || local_3c8 == (void *)0x0) {
              local_360 = (void *)0x0;
              uStack_358 = 0;
              local_378 = local_388;
              lStack_370 = local_380;
              if (-1 < local_380 || local_388 == (void *)0x0) {
                mnf::Manifold::applyTransport(local_b8,&local_168,&local_2f8,&local_3b8,&local_378);
                free(local_360);
                free(local_3a0);
                free(local_2d0);
                uStack_180 = 0;
                local_198 = local_328;
                uStack_190 = local_320;
                local_188 = local_318;
                if ((long)(local_318 | local_320) < 0 && local_328 != (void *)0x0)
                goto LAB_0011805a;
                uStack_180 = local_320;
                uStack_2e8 = 0;
                local_2e0 = (void *)0x0;
                local_2f8 = (void *)0x0;
                pvStack_2f0 = (void *)0x0;
                local_2d0 = (void *)0x0;
                uStack_2c8 = 0;
                local_2c0 = 0;
                Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
                construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                          ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *
                           )&local_2f8,&local_350);
                local_3a0 = (void *)0x0;
                uStack_398 = 0;
                local_3b8 = local_3c8;
                lStack_3b0 = local_3c0;
                if (-1 < local_3c0 || local_3c8 == (void *)0x0) {
                  local_360 = (void *)0x0;
                  uStack_358 = 0;
                  local_378 = local_388;
                  lStack_370 = local_380;
                  if (-1 < local_380 || local_388 == (void *)0x0) {
                    mnf::Manifold::applyInvTransport
                              (local_b8,&local_198,&local_2f8,&local_3b8,&local_378);
                    free(local_360);
                    free(local_3a0);
                    free(local_2d0);
                    uStack_1b0 = 0;
                    local_1c8 = local_350;
                    uStack_1c0 = local_348;
                    local_1b8 = local_340;
                    if ((long)(local_340 | local_348) < 0 && local_350 != (void *)0x0)
                    goto LAB_0011805a;
                    uStack_1b0 = local_348;
                    local_2e0 = (void *)0x0;
                    uStack_2d8 = 0;
                    local_2f8 = local_3c8;
                    pvStack_2f0 = (void *)local_3c0;
                    if (-1 < local_3c0 || local_3c8 == (void *)0x0) {
                      mnf::Manifold::getIdentityOnTxM(local_b8,&local_1c8,&local_2f8);
                      free(local_2e0);
                      mnf::utils::set_is_malloc_allowed(true);
                      Eigen::internal::is_malloc_allowed_impl(bool,bool)::value = 1;
                      free(local_328);
                      free(local_310);
                      free(local_350);
                      free(__ptr_01);
                      free(__ptr_00);
                      free(local_d0[0]);
                      free(__ptr);
                      free(local_388);
                      free(local_338);
                      free(local_3c8);
                      mnf::Manifold::~Manifold((Manifold *)local_b8);
                      return;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00118024:
  __function = 
  "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
  ;
LAB_0011806f:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,__function);
}

Assistant:

BOOST_AUTO_TEST_CASE(S2NoAllocation)
{
  // We only test here that the operations on the manifold do not create
  // temporary. Passing arguments that are not recognize by the Eigen::Ref will
  // create temporaries, but this is the user's fault.
  S2 Space;
  Index c = 3;
  // VectorXd x = VectorXd::Random(Space.representationDim());
  // VectorXd y = VectorXd::Random(Space.representationDim());
  VectorXd x = Space.createRandomPoint().value();
  VectorXd y = Space.createRandomPoint().value();
  VectorXd vx = Space.randVec(x);
  VectorXd z(Space.representationDim());
  MatrixXd J0 = MatrixXd::Random(c, Space.representationDim());
  MatrixXd J1(c, Space.representationDim());
  MatrixXd J2(c, Space.representationDim());
  MatrixXd H0 = MatrixXd::Random(Space.tangentDim(), Space.tangentDim());
  MatrixXd H1 = MatrixXd::Random(Space.tangentDim(), Space.tangentDim());
  MatrixXd H2 = MatrixXd::Random(Space.tangentDim(), Space.tangentDim());

  internal::set_is_malloc_allowed(false);
  utils::set_is_malloc_allowed(false);
  {
    Space.retractation(z, x, vx);
    Space.pseudoLog(z, x, y);
    Space.applyDiffRetractation(J1, J0, x);
    Space.applyTransport(H1, H0, x, vx);
    Space.applyInvTransport(H2, H0, x, vx);
    Space.getIdentityOnTxM(H0, x);
  }
  utils::set_is_malloc_allowed(true);
  internal::set_is_malloc_allowed(true);
}